

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O1

void __thiscall sptk::reaper::EpochTracker::GetResidualPulses(EpochTracker *this)

{
  float fVar1;
  float fVar2;
  pointer pfVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ResidPeak p;
  value_type local_a0;
  
  fVar1 = this->sample_rate_;
  iVar7 = (int)(this->peak_delay_ * fVar1 + 0.5);
  fVar2 = this->skew_delay_;
  iVar6 = (int)((ulong)((long)(this->norm_residual_).
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->norm_residual_).
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  std::
  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
  ::resize(&this->resid_peaks_,0);
  std::vector<float,_std::allocator<float>_>::resize
            (&this->peaks_debug_,
             (long)(this->residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  pfVar3 = (this->peaks_debug_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->peaks_debug_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar3;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 2;
    memset(pfVar3,0,(lVar4 + (ulong)(lVar4 == 0)) * 4);
  }
  if (iVar7 < iVar6 - iVar7) {
    lVar5 = (long)iVar7;
    lVar4 = (long)(int)(fVar1 * fVar2 + 0.5);
    lVar8 = 0;
    do {
      pfVar3 = (this->norm_residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar1 = pfVar3[lVar5 + lVar8];
      if ((((fVar1 <= -1.0) && (fVar1 < pfVar3[lVar5 + lVar8 + -1])) &&
          (fVar1 <= pfVar3[lVar5 + lVar8 + 1])) &&
         ((fVar1 <= pfVar3[lVar8] && (fVar1 <= pfVar3[lVar8 + lVar5 * 2])))) {
        local_a0.past.
        super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a0.past.
        super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a0.future.
        super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a0.past.
        super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a0.future.
        super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a0.future.
        super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a0.nccf_periods.super__Vector_base<short,_std::allocator<short>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a0.nccf_periods.super__Vector_base<short,_std::allocator<short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a0.nccf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a0.nccf_periods.super__Vector_base<short,_std::allocator<short>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_a0.nccf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_a0.nccf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a0.resid_index = iVar7 + (int)lVar8;
        local_a0.frame_index =
             (int32_t)(((float)local_a0.resid_index / this->sample_rate_) /
                       this->internal_frame_interval_ + 0.5);
        if (this->n_feature_frames_ <= local_a0.frame_index) {
          local_a0.frame_index = this->n_feature_frames_ + -1;
        }
        local_a0.peak_quality =
             ((pfVar3[lVar8] + pfVar3[lVar8 + lVar5 * 2]) * 0.5 - fVar1) * this->peak_prominence_wt_
             + (-(pfVar3[(lVar5 + lVar8) - lVar4] - pfVar3[lVar5 + lVar4 + lVar8]) *
                this->peak_skew_wt_ - fVar1 * this->peak_val_wt_);
        if (local_a0.peak_quality < this->peak_quality_floor_) {
          local_a0.peak_quality = this->peak_quality_floor_;
        }
        std::
        vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
        ::push_back(&this->resid_peaks_,&local_a0);
        (this->peaks_debug_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[lVar5 + lVar8] = local_a0.peak_quality;
        if (local_a0.past.
            super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.past.
                          super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_a0.future.
            super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.future.
                          super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_a0.nccf_periods.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.nccf_periods.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_a0.nccf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.nccf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      lVar8 = lVar8 + 1;
    } while (iVar6 + iVar7 * -2 != (int)lVar8);
  }
  return;
}

Assistant:

void EpochTracker::GetResidualPulses(void) {
  int32_t peak_ind = RoundUp(peak_delay_ * sample_rate_);
  int32_t skew_ind = RoundUp(skew_delay_ * sample_rate_);
  float min_peak = -1.0;  // minimum value that will be considered as a peak
  int32_t limit = norm_residual_.size() - peak_ind;
  resid_peaks_.resize(0);
  peaks_debug_.resize(residual_.size());
  for (size_t i = 0; i < peaks_debug_.size(); ++i) {
    peaks_debug_[i] = 0.0;
  }
  for (int32_t i = peak_ind; i < limit; ++i) {
    float val = norm_residual_[i];
    if (val > min_peak) {
      continue;
    }
    if ((norm_residual_[i-1] > val) && (val <= norm_residual_[i+1])) {
      float vm_peak = norm_residual_[i - peak_ind];
      float vp_peak = norm_residual_[i + peak_ind];
      if ((vm_peak < val) || (vp_peak < val)) {
        continue;
      }
      float vm_skew = norm_residual_[i - skew_ind];
      float vp_skew = norm_residual_[i + skew_ind];
      float sharp = (0.5 * (vp_peak + vm_peak)) - val;
      float skew = -(vm_skew - vp_skew);
      ResidPeak p;
      p.resid_index = i;
      float time = static_cast<float>(i) / sample_rate_;
      p.frame_index = RoundUp(time / internal_frame_interval_);
      if (p.frame_index >= n_feature_frames_) {
        p.frame_index = n_feature_frames_ - 1;
      }
      p.peak_quality = (-val * peak_val_wt_) + (skew * peak_skew_wt_) +
          (sharp * peak_prominence_wt_);
      if (p.peak_quality < peak_quality_floor_) {
        p.peak_quality = peak_quality_floor_;
      }
      resid_peaks_.push_back(p);
      peaks_debug_[i] = p.peak_quality;
    }
  }
}